

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

sub_form __thiscall
goodform::object_validator::at(object_validator *this,string *key,any *default_variant)

{
  bool bVar1;
  pointer ppVar2;
  _Base_ptr local_50;
  _Self local_40;
  _Self local_38;
  const_iterator it;
  any *default_variant_local;
  string *key_local;
  object_validator *this_local;
  sub_form ret;
  
  it._M_node = (_Base_ptr)default_variant;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::find(this->value_,key);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
       ::end(this->value_);
  bVar1 = std::operator!=(&local_38,&local_40);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>
             ::operator->(&local_38);
    local_50 = (_Base_ptr)&ppVar2->second;
  }
  else {
    local_50 = it._M_node;
  }
  sub_form::sub_form((sub_form *)&this_local,(any *)local_50,this->error_);
  return _this_local;
}

Assistant:

sub_form object_validator::at(const std::string& key, const any& default_variant)
  {
    auto it = this->value_.find(key);
    sub_form ret(it != this->value_.end() ? it->second : default_variant, this->error_);
    return ret;
  }